

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O3

QErrorMessage * QErrorMessage::qtHandler(void)

{
  QErrorMessage *pQVar1;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (qtMessageHandler == (QErrorMessage *)0x0) {
    pQVar1 = (QErrorMessage *)operator_new(0x28);
    QErrorMessage(pQVar1,(QWidget *)0x0);
    qtMessageHandler = pQVar1;
    qAddPostRoutine(deleteStaticcQErrorMessage);
    pQVar1 = qtMessageHandler;
    QCoreApplication::applicationName();
    QWidget::setWindowTitle((QWidget *)pQVar1,&local_30);
    if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
      }
    }
    originalMessageHandler = (QtMessageHandler)qInstallMessageHandler(jump);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return qtMessageHandler;
  }
  __stack_chk_fail();
}

Assistant:

QErrorMessage * QErrorMessage::qtHandler()
{
    if (!qtMessageHandler) {
        qtMessageHandler = new QErrorMessage(nullptr);
        qAddPostRoutine(deleteStaticcQErrorMessage); // clean up
        qtMessageHandler->setWindowTitle(QCoreApplication::applicationName());
        originalMessageHandler = qInstallMessageHandler(jump);
    }
    return qtMessageHandler;
}